

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Function * soul::StructuralParser::cloneFunction(Allocator *allocator,Function *functionToClone)

{
  long lVar1;
  long lVar2;
  Function *pFVar3;
  int iVar4;
  undefined4 extraout_var;
  ModuleBase *parentScope;
  long *plVar5;
  StructuralParser p;
  undefined4 extraout_var_00;
  
  iVar4 = (*(functionToClone->super_ASTObject)._vptr_ASTObject[3])(functionToClone);
  parentScope = (ModuleBase *)
                (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x28))
                          ((long *)CONCAT44(extraout_var,iVar4));
  if (parentScope == (ModuleBase *)0x0) {
    throwInternalCompilerError("parentModule != nullptr","cloneFunction",0x6c);
  }
  parentScope->isFullyResolved = false;
  StructuralParser(&p,allocator,&(functionToClone->super_ASTObject).context.location,parentScope);
  iVar4 = (*(parentScope->super_ASTObject)._vptr_ASTObject[0xc])(parentScope);
  plVar5 = (long *)CONCAT44(extraout_var_00,iVar4);
  if (plVar5 != (long *)0x0) {
    lVar1 = *plVar5;
    lVar2 = plVar5[1];
    p.module.object = parentScope;
    parseFunctionOrStateVariable(&p);
    if (plVar5[1] - *plVar5 >> 3 == (lVar2 - lVar1 >> 3) + 1) {
      pFVar3 = *(Function **)(plVar5[1] + -8);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::~Tokeniser(&p.super_SOULTokeniser);
      return pFVar3;
    }
    throwInternalCompilerError("functionList->size() == oldSize + 1","cloneFunction",0x75);
  }
  throwInternalCompilerError("functionList != nullptr","cloneFunction",0x71);
}

Assistant:

static AST::Function& cloneFunction (AST::Allocator& allocator,
                                         const AST::Function& functionToClone)
    {
        auto parentModule = functionToClone.getParentScope()->getAsModule();
        SOUL_ASSERT (parentModule != nullptr);

        parentModule->isFullyResolved = false;
        StructuralParser p (allocator, functionToClone.context.location, *parentModule);
        auto functionList = parentModule->getFunctionList();
        SOUL_ASSERT (functionList != nullptr);
        auto oldSize = functionList->size();
        p.module = *parentModule;
        p.parseFunctionOrStateVariable();
        SOUL_ASSERT (functionList->size() == oldSize + 1);
        ignoreUnused (oldSize);
        return functionList->back();
    }